

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O2

void __thiscall Ui_MainWindow::retranslateUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QPushButton *pQVar1;
  QLabel *pQVar2;
  QArrayDataPointer<char16_t> local_30;
  
  QCoreApplication::translate((char *)&local_30,"MainWindow","MainWindow",0);
  QWidget::setWindowTitle((QString *)MainWindow);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar1 = this->beginNewGameButton;
  QCoreApplication::translate((char *)&local_30,"MainWindow","Begin new game",0);
  QAbstractButton::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar2 = this->player1Label;
  QCoreApplication::translate((char *)&local_30,"MainWindow","Player 1",0);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar2 = this->player1Score;
  QCoreApplication::translate((char *)&local_30,"MainWindow","0",0);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar2 = this->player2Label;
  QCoreApplication::translate((char *)&local_30,"MainWindow","Player 2",0);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  pQVar2 = this->player2Score;
  QCoreApplication::translate((char *)&local_30,"MainWindow","0",0);
  QLabel::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

void retranslateUi(QMainWindow *MainWindow)
    {
        MainWindow->setWindowTitle(QCoreApplication::translate("MainWindow", "MainWindow", nullptr));
        beginNewGameButton->setText(QCoreApplication::translate("MainWindow", "Begin new game", nullptr));
        player1Label->setText(QCoreApplication::translate("MainWindow", "Player 1", nullptr));
        player1Score->setText(QCoreApplication::translate("MainWindow", "0", nullptr));
        player2Label->setText(QCoreApplication::translate("MainWindow", "Player 2", nullptr));
        player2Score->setText(QCoreApplication::translate("MainWindow", "0", nullptr));
    }